

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O1

ImVec4_Simple igColorConvertU32ToFloat4_nonUDT2(ImU32 in)

{
  undefined8 in_XMM1_Qa;
  ImVec4_Simple IVar1;
  undefined8 extraout_XMM0_Qa;
  
  ImGui::ColorConvertU32ToFloat4(in);
  IVar1.z = (float)(int)in_XMM1_Qa;
  IVar1.w = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  IVar1.x = (float)(int)extraout_XMM0_Qa;
  IVar1.y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return IVar1;
}

Assistant:

CIMGUI_API ImVec4_Simple *_igColorConvertU32ToFloat4_nonUDT2 (ImU32 *larg1) {
  ImVec4_Simple * lresult = (ImVec4_Simple *)0 ;
  ImU32 arg1 ;
  ImVec4_Simple result;
  
  arg1 = *larg1;
  try {
    result = igColorConvertU32ToFloat4_nonUDT2(arg1);
    lresult = new ImVec4_Simple(result);
    return lresult;
  } catch (...) {
    return (ImVec4_Simple *)0;
  }
}